

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O1

void __thiscall re2::Regexp::ParseState::DoCollapse(ParseState *this,RegexpOp op)

{
  ushort uVar1;
  bool bVar2;
  Regexp **sub;
  Regexp *pRVar3;
  ulong uVar4;
  undefined1 uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  Regexp **ppRVar10;
  ParseState *pPVar11;
  ParseState *re;
  StringPiece *pSVar12;
  ParseState *pPVar13;
  ulong uVar14;
  
  re = (ParseState *)this->stacktop_;
  if ((re == (ParseState *)0x0) ||
     (uVar5 = (undefined1)re->flags_, (OneLine|ClassNL|FoldCase) < (byte)uVar5)) {
    pPVar11 = (ParseState *)0x0;
    uVar14 = 0;
  }
  else {
    uVar14 = 0;
    pPVar11 = re;
    do {
      uVar6 = 1;
      if ((byte)uVar5 == op) {
        uVar6 = (uint)*(ushort *)&pPVar11->field_0x6;
      }
      uVar14 = (ulong)((int)uVar14 + uVar6);
      pPVar11 = (ParseState *)
                ((anon_union_8_2_3df47e5c_for_Regexp_7 *)&pPVar11->whole_regexp_)[1].submany_;
    } while ((pPVar11 != (ParseState *)0x0) &&
            (uVar5 = (undefined1)pPVar11->flags_, (byte)uVar5 < (OneLine|ClassNL|Literal)));
  }
  if ((re == (ParseState *)0x0) ||
     ((ParseState *)((anon_union_8_2_3df47e5c_for_Regexp_7 *)&re->whole_regexp_)[1].submany_ !=
      pPVar11)) {
    pPVar11 = (ParseState *)(uVar14 << 3);
    sub = (Regexp **)operator_new__((ulong)pPVar11);
    if ((re == (ParseState *)0x0) ||
       (uVar5 = (undefined1)re->flags_, uVar8 = uVar14, (OneLine|ClassNL|FoldCase) < (byte)uVar5)) {
      pPVar13 = (ParseState *)0x0;
    }
    else {
      do {
        pPVar13 = *(ParseState **)&(re->whole_regexp_).length_;
        iVar7 = (int)uVar8;
        if ((byte)uVar5 == op) {
          uVar1 = *(ushort *)&re->field_0x6;
          uVar4 = (ulong)uVar1;
          if (uVar4 < 2) {
            pSVar12 = &re->whole_regexp_;
          }
          else {
            pSVar12 = (StringPiece *)(re->whole_regexp_).ptr_;
          }
          if (uVar4 != 0) {
            ppRVar10 = sub + (long)iVar7 + -1;
            lVar9 = uVar4 + 1;
            do {
              pRVar3 = Incref(*(Regexp **)((long)(pSVar12 + -1) + lVar9 * 8));
              *ppRVar10 = pRVar3;
              ppRVar10 = ppRVar10 + -1;
              lVar9 = lVar9 + -1;
            } while (1 < lVar9);
            uVar8 = (ulong)(iVar7 - (uint)uVar1);
          }
          Decref((Regexp *)re);
          pPVar11 = re;
        }
        else {
          pRVar3 = FinishRegexp(pPVar11,(Regexp *)re);
          uVar8 = (ulong)(iVar7 - 1);
          sub[(long)iVar7 + -1] = pRVar3;
        }
      } while ((pPVar13 != (ParseState *)0x0) &&
              (uVar5 = (undefined1)pPVar13->flags_, re = pPVar13,
              (byte)uVar5 < (OneLine|ClassNL|Literal)));
    }
    pRVar3 = ConcatOrAlternate(op,sub,(int)uVar14,this->flags_,true);
    operator_delete__(sub);
    bVar2 = ComputeSimple(pRVar3);
    pRVar3->simple_ = bVar2;
    pRVar3->down_ = (Regexp *)pPVar13;
    this->stacktop_ = pRVar3;
  }
  return;
}

Assistant:

void Regexp::ParseState::DoCollapse(RegexpOp op) {
  // Scan backward to marker, counting children of composite.
  int n = 0;
  Regexp* next = NULL;
  Regexp* sub;
  for (sub = stacktop_; sub != NULL && !IsMarker(sub->op()); sub = next) {
    next = sub->down_;
    if (sub->op_ == op)
      n += sub->nsub_;
    else
      n++;
  }

  // If there's just one child, leave it alone.
  // (Concat of one thing is that one thing; alternate of one thing is same.)
  if (stacktop_ != NULL && stacktop_->down_ == next)
    return;

  // Construct op (alternation or concatenation), flattening op of op.
  Regexp** subs = new Regexp*[n];
  next = NULL;
  int i = n;
  for (sub = stacktop_; sub != NULL && !IsMarker(sub->op()); sub = next) {
    next = sub->down_;
    if (sub->op_ == op) {
      Regexp** sub_subs = sub->sub();
      for (int k = sub->nsub_ - 1; k >= 0; k--)
        subs[--i] = sub_subs[k]->Incref();
      sub->Decref();
    } else {
      subs[--i] = FinishRegexp(sub);
    }
  }

  Regexp* re = ConcatOrAlternate(op, subs, n, flags_, true);
  delete[] subs;
  re->simple_ = re->ComputeSimple();
  re->down_ = next;
  stacktop_ = re;
}